

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::SwapMethod::doRNEMDImpl
          (SwapMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  RNEMDFluxType RVar8;
  Snapshot *pSVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  StuntDouble *pSVar20;
  Vector3d *pVVar21;
  ulong uVar22;
  double *pdVar23;
  uint i;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  StuntDouble *pSVar28;
  bool bVar29;
  undefined4 uVar30;
  double tmp;
  undefined4 uVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  int selej;
  int selei;
  Vector3d pos;
  Mat3x3d I;
  double local_110;
  double local_108;
  StuntDouble *local_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  double local_e8;
  double local_d8 [3];
  int local_c0;
  int local_bc;
  double local_b8;
  SelectionManager *local_b0;
  Vector3d local_a8;
  StuntDouble *local_88;
  StuntDouble *local_80;
  double local_78 [8];
  double local_38;
  
  if ((this->super_RNEMD).doRNEMD_ != true) {
    return;
  }
  local_b0 = smanB;
  pSVar20 = SelectionManager::beginSelected(smanA,&local_bc);
  local_80 = pSVar20;
  if (pSVar20 == (StuntDouble *)0x0) {
    local_108 = 0.0;
    local_100 = (StuntDouble *)0x0;
  }
  else {
    bVar29 = true;
    local_108 = 0.0;
    local_100 = (StuntDouble *)0x0;
    do {
      pVVar21 = (Vector3d *)
                ((long)pSVar20->localIndex_ * 0x18 +
                *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_));
      local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
      local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
      local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
      if (pVVar21 != &local_a8) {
        lVar24 = 0;
        do {
          local_a8.super_Vector<double,_3U>.data_[lVar24] =
               (pVVar21->super_Vector<double,_3U>).data_[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
      }
      if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
        Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&local_a8);
      }
      dVar37 = pSVar20->mass_;
      pSVar9 = pSVar20->snapshotMan_->currentSnapshot_;
      lVar26 = (long)pSVar20->localIndex_;
      lVar24 = *(long *)((long)&(pSVar9->atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
      local_d8[2] = *(double *)(lVar24 + 0x10 + lVar26 * 0x18);
      pdVar23 = (double *)(lVar24 + lVar26 * 0x18);
      local_d8[0] = *pdVar23;
      local_d8[1] = pdVar23[1];
      uVar30 = 0;
      uVar31 = 0;
      dVar33 = 0.0;
      switch((this->super_RNEMD).rnemdFluxType_) {
      case rnemdKE:
        lVar24 = 0;
        do {
          dVar33 = dVar33 + local_d8[lVar24] * local_d8[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        dVar37 = dVar37 * dVar33;
        if (pSVar20->objType_ - otDAtom < 2) {
          lVar24 = *(long *)((long)&(pSVar9->atomData).angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
          local_e8 = *(double *)(lVar24 + 0x10 + lVar26 * 0x18);
          puVar2 = (undefined4 *)(lVar24 + lVar26 * 0x18);
          local_f8 = *puVar2;
          uStack_f4 = puVar2[1];
          uStack_f0 = puVar2[2];
          uStack_ec = puVar2[3];
          (*pSVar20->_vptr_StuntDouble[5])(local_78,pSVar20);
          if (pSVar20->linear_ == true) {
            iVar7 = pSVar20->linearAxis_;
            uVar25 = (ulong)(((iVar7 + 1) / 3) * -3 + iVar7 + 1);
            uVar22 = (ulong)(iVar7 + ((iVar7 + 2) / 3) * -3 + 2);
            dVar33 = (*(double *)(&local_f8 + uVar25 * 2) * *(double *)(&local_f8 + uVar25 * 2)) /
                     local_78[uVar25 * 4];
            dVar32 = *(double *)(&local_f8 + uVar22 * 2) * *(double *)(&local_f8 + uVar22 * 2);
            pdVar23 = local_78 + uVar22 * 4;
          }
          else {
            auVar34._0_8_ =
                 (double)CONCAT44(uStack_f4,local_f8) * (double)CONCAT44(uStack_f4,local_f8);
            auVar34._8_8_ =
                 (double)CONCAT44(uStack_ec,uStack_f0) * (double)CONCAT44(uStack_ec,uStack_f0);
            auVar35._8_4_ = SUB84(local_78[4],0);
            auVar35._0_8_ = local_78[0];
            auVar35._12_4_ = (int)((ulong)local_78[4] >> 0x20);
            auVar35 = divpd(auVar34,auVar35);
            dVar33 = auVar35._8_8_ + auVar35._0_8_;
            dVar32 = local_e8 * local_e8;
            pdVar23 = &local_38;
          }
          dVar37 = dVar37 + dVar32 / *pdVar23 + dVar33;
        }
        dVar37 = dVar37 * 0.5;
        break;
      default:
        goto switchD_0023551a_caseD_1;
      case rnemdPx:
        dVar37 = dVar37 * local_d8[0];
        break;
      case rnemdPy:
        dVar37 = dVar37 * local_d8[1];
        break;
      case rnemdPz:
        dVar37 = dVar37 * local_d8[2];
      }
      uVar30 = SUB84(dVar37,0);
      uVar31 = (undefined4)((ulong)dVar37 >> 0x20);
switchD_0023551a_caseD_1:
      if ((bVar29) ||
         (local_108 <= (double)CONCAT44(uVar31,uVar30) &&
          (double)CONCAT44(uVar31,uVar30) != local_108)) {
        local_108 = (double)CONCAT44(uVar31,uVar30);
        local_100 = pSVar20;
      }
      pSVar20 = SelectionManager::nextSelected(smanA,&local_bc);
      bVar29 = false;
    } while (pSVar20 != (StuntDouble *)0x0);
  }
  pSVar20 = SelectionManager::beginSelected(local_b0,&local_c0);
  if (pSVar20 != (StuntDouble *)0x0) {
    bVar29 = true;
    local_110 = 0.0;
    pSVar28 = (StuntDouble *)0x0;
    local_88 = pSVar20;
    do {
      pVVar21 = (Vector3d *)
                ((long)pSVar20->localIndex_ * 0x18 +
                *(long *)((long)&(pSVar20->snapshotMan_->currentSnapshot_->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_));
      local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
      local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
      local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
      if (pVVar21 != &local_a8) {
        lVar24 = 0;
        do {
          local_a8.super_Vector<double,_3U>.data_[lVar24] =
               (pVVar21->super_Vector<double,_3U>).data_[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
      }
      if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
        Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&local_a8);
      }
      dVar37 = pSVar20->mass_;
      pSVar9 = pSVar20->snapshotMan_->currentSnapshot_;
      lVar26 = (long)pSVar20->localIndex_;
      lVar24 = *(long *)((long)&(pSVar9->atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
      local_d8[2] = *(double *)(lVar24 + 0x10 + lVar26 * 0x18);
      pdVar23 = (double *)(lVar24 + lVar26 * 0x18);
      local_d8[0] = *pdVar23;
      local_d8[1] = pdVar23[1];
      uVar30 = 0;
      uVar31 = 0;
      dVar33 = 0.0;
      switch((this->super_RNEMD).rnemdFluxType_) {
      case rnemdKE:
        lVar24 = 0;
        do {
          dVar33 = dVar33 + local_d8[lVar24] * local_d8[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        dVar37 = dVar37 * dVar33;
        if (pSVar20->objType_ - otDAtom < 2) {
          lVar24 = *(long *)((long)&(pSVar9->atomData).angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar20->storage_);
          local_e8 = *(double *)(lVar24 + 0x10 + lVar26 * 0x18);
          puVar2 = (undefined4 *)(lVar24 + lVar26 * 0x18);
          local_f8 = *puVar2;
          uStack_f4 = puVar2[1];
          uStack_f0 = puVar2[2];
          uStack_ec = puVar2[3];
          local_b8 = dVar37;
          (*pSVar20->_vptr_StuntDouble[5])(local_78,pSVar20);
          if (pSVar20->linear_ == true) {
            iVar7 = pSVar20->linearAxis_;
            uVar25 = (ulong)(((iVar7 + 1) / 3) * -3 + iVar7 + 1);
            uVar22 = (ulong)(iVar7 + ((iVar7 + 2) / 3) * -3 + 2);
            dVar37 = (*(double *)(&local_f8 + uVar25 * 2) * *(double *)(&local_f8 + uVar25 * 2)) /
                     local_78[uVar25 * 4];
            dVar33 = *(double *)(&local_f8 + uVar22 * 2) * *(double *)(&local_f8 + uVar22 * 2);
            pdVar23 = local_78 + uVar22 * 4;
          }
          else {
            auVar36._0_8_ =
                 (double)CONCAT44(uStack_f4,local_f8) * (double)CONCAT44(uStack_f4,local_f8);
            auVar36._8_8_ =
                 (double)CONCAT44(uStack_ec,uStack_f0) * (double)CONCAT44(uStack_ec,uStack_f0);
            auVar10._8_4_ = SUB84(local_78[4],0);
            auVar10._0_8_ = local_78[0];
            auVar10._12_4_ = (int)((ulong)local_78[4] >> 0x20);
            auVar35 = divpd(auVar36,auVar10);
            dVar37 = auVar35._8_8_ + auVar35._0_8_;
            dVar33 = local_e8 * local_e8;
            pdVar23 = &local_38;
          }
          dVar37 = local_b8 + dVar33 / *pdVar23 + dVar37;
        }
        dVar37 = dVar37 * 0.5;
        break;
      default:
        goto switchD_002357b8_caseD_1;
      case rnemdPx:
        dVar37 = dVar37 * local_d8[0];
        break;
      case rnemdPy:
        dVar37 = dVar37 * local_d8[1];
        break;
      case rnemdPz:
        dVar37 = dVar37 * local_d8[2];
      }
      uVar30 = SUB84(dVar37,0);
      uVar31 = (undefined4)((ulong)dVar37 >> 0x20);
switchD_002357b8_caseD_1:
      if ((bVar29) ||
         ((double)CONCAT44(uVar31,uVar30) <= local_110 &&
          local_110 != (double)CONCAT44(uVar31,uVar30))) {
        local_110 = (double)CONCAT44(uVar31,uVar30);
        pSVar28 = pSVar20;
      }
      pSVar20 = SelectionManager::nextSelected(local_b0,&local_c0);
      bVar29 = false;
    } while (pSVar20 != (StuntDouble *)0x0);
    if (local_80 != (StuntDouble *)0x0 && local_88 != (StuntDouble *)0x0) {
      if (local_110 < local_108) {
        RVar8 = (this->super_RNEMD).rnemdFluxType_;
        if (rnemdPz < RVar8) {
          return;
        }
        pSVar9 = pSVar28->snapshotMan_->currentSnapshot_;
        lVar24 = (long)pSVar28->localIndex_;
        puVar2 = (undefined4 *)
                 (*(long *)((long)&(pSVar9->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar28->storage_) +
                 lVar24 * 0x18);
        uVar30 = *puVar2;
        uVar31 = puVar2[1];
        uVar11 = puVar2[2];
        uVar12 = puVar2[3];
        uVar5 = *(undefined8 *)(puVar2 + 4);
        puVar3 = (undefined4 *)
                 (*(long *)((long)&(local_100->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_100->storage_)
                 + (long)local_100->localIndex_ * 0x18);
        uVar13 = *puVar3;
        uVar14 = puVar3[1];
        uVar15 = puVar3[2];
        uVar16 = puVar3[3];
        uVar6 = *(undefined8 *)(puVar3 + 4);
        switch(RVar8) {
        case rnemdKE:
          goto switchD_002359f8_caseD_0;
        default:
          return;
        case rnemdPx:
          *puVar2 = uVar13;
          puVar2[1] = uVar14;
          *puVar3 = uVar30;
          puVar3[1] = uVar31;
          puVar3[2] = uVar15;
          puVar3[3] = uVar16;
          *(undefined8 *)(puVar3 + 4) = uVar6;
          (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[0] =
               (local_108 - local_110) +
               (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[0];
          return;
        case rnemdPy:
          puVar2[4] = uVar15;
          puVar2[5] = uVar16;
          *puVar3 = uVar13;
          puVar3[1] = uVar14;
          puVar3[2] = uVar11;
          puVar3[3] = uVar12;
          *(undefined8 *)(puVar3 + 4) = uVar6;
          (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[1] =
               (local_108 - local_110) +
               (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[1];
          return;
        case rnemdPz:
          *(undefined8 *)(puVar2 + 4) = uVar6;
          *puVar3 = uVar13;
          puVar3[1] = uVar14;
          puVar3[2] = uVar15;
          puVar3[3] = uVar16;
          *(undefined8 *)(puVar3 + 4) = uVar5;
          (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[2] =
               (local_108 - local_110) +
               (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[2];
          return;
        }
      }
      painCave.errMsg[0x30] = '_';
      painCave.errMsg[0x31] = 'v';
      painCave.errMsg[0x32] = 'a';
      painCave.errMsg[0x33] = 'l';
      painCave.errMsg[0x34] = ' ';
      painCave.errMsg[0x35] = '>';
      painCave.errMsg[0x36] = ' ';
      painCave.errMsg[0x37] = 'm';
      painCave.errMsg[0x38] = 'a';
      painCave.errMsg[0x39] = 'x';
      painCave.errMsg[0x3a] = '_';
      painCave.errMsg[0x3b] = 'v';
      painCave.errMsg[0x3c] = 'a';
      painCave.errMsg[0x3d] = 'l';
      painCave.errMsg[0x3e] = '\n';
      painCave.errMsg[0x3f] = '\0';
      painCave.errMsg[0x20] = 'r';
      painCave.errMsg[0x21] = 'm';
      painCave.errMsg[0x22] = 'e';
      painCave.errMsg[0x23] = 'd';
      painCave.errMsg[0x24] = ' ';
      painCave.errMsg[0x25] = 'b';
      painCave.errMsg[0x26] = 'e';
      painCave.errMsg[0x27] = 'c';
      painCave.errMsg[0x28] = 'a';
      painCave.errMsg[0x29] = 'u';
      painCave.errMsg[0x2a] = 's';
      painCave.errMsg[0x2b] = 'e';
      painCave.errMsg[0x2c] = ' ';
      painCave.errMsg[0x2d] = 'm';
      painCave.errMsg[0x2e] = 'i';
      painCave.errMsg[0x2f] = 'n';
      painCave.errMsg[0x10] = 'c';
      painCave.errMsg[0x11] = 'h';
      painCave.errMsg[0x12] = 'a';
      painCave.errMsg[0x13] = 'n';
      painCave.errMsg[0x14] = 'g';
      painCave.errMsg[0x15] = 'e';
      painCave.errMsg[0x16] = ' ';
      painCave.errMsg[0x17] = 'N';
      painCave.errMsg[0x18] = 'O';
      painCave.errMsg[0x19] = 'T';
      painCave.errMsg[0x1a] = ' ';
      painCave.errMsg[0x1b] = 'p';
      painCave.errMsg[0x1c] = 'e';
      painCave.errMsg[0x1d] = 'r';
      painCave.errMsg[0x1e] = 'f';
      painCave.errMsg[0x1f] = 'o';
      painCave.errMsg[0] = 'R';
      painCave.errMsg[1] = 'N';
      painCave.errMsg[2] = 'E';
      painCave.errMsg[3] = 'M';
      painCave.errMsg[4] = 'D';
      painCave.errMsg[5] = ':';
      painCave.errMsg[6] = ':';
      painCave.errMsg[7] = 'd';
      painCave.errMsg[8] = 'o';
      painCave.errMsg[9] = 'S';
      painCave.errMsg[10] = 'w';
      painCave.errMsg[0xb] = 'a';
      painCave.errMsg[0xc] = 'p';
      painCave.errMsg[0xd] = ' ';
      painCave.errMsg[0xe] = 'e';
      painCave.errMsg[0xf] = 'x';
      goto LAB_00235af5;
    }
  }
  memcpy(&painCave,
         "Swap exchange NOT performed because selected object\n\twas not present in at least one of the two slabs.\n"
         ,0x68);
LAB_00235af5:
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  puVar1 = &(this->super_RNEMD).failTrialCount_;
  *puVar1 = *puVar1 + 1;
  return;
switchD_002359f8_caseD_0:
  *puVar2 = uVar13;
  puVar2[1] = uVar14;
  puVar2[2] = uVar15;
  puVar2[3] = uVar16;
  *(undefined8 *)(puVar2 + 4) = uVar6;
  *puVar3 = uVar30;
  puVar3[1] = uVar31;
  puVar3[2] = uVar11;
  puVar3[3] = uVar12;
  *(undefined8 *)(puVar3 + 4) = uVar5;
  if ((pSVar28->objType_ - otDAtom < 2) && (local_100->objType_ - otDAtom < 2)) {
    lVar26 = *(long *)((long)&(pSVar9->atomData).angularMomentum.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar28->storage_);
    uVar5 = *(undefined8 *)(lVar26 + 0x10 + lVar24 * 0x18);
    puVar4 = (undefined8 *)(lVar26 + lVar24 * 0x18);
    uVar6 = *puVar4;
    uVar17 = puVar4[1];
    lVar27 = (long)local_100->localIndex_;
    lVar24 = *(long *)((long)&(local_100->snapshotMan_->currentSnapshot_->atomData).angularMomentum.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_100->storage_);
    iVar7 = pSVar28->localIndex_;
    lVar26 = *(long *)((long)&(pSVar28->snapshotMan_->currentSnapshot_->atomData).angularMomentum.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar28->storage_);
    puVar4 = (undefined8 *)(lVar24 + lVar27 * 0x18);
    uVar18 = *puVar4;
    uVar19 = puVar4[1];
    *(undefined8 *)(lVar26 + 0x10 + (long)iVar7 * 0x18) =
         *(undefined8 *)(lVar24 + 0x10 + lVar27 * 0x18);
    puVar4 = (undefined8 *)(lVar26 + (long)iVar7 * 0x18);
    *puVar4 = uVar18;
    puVar4[1] = uVar19;
    *(undefined8 *)(lVar24 + 0x10 + lVar27 * 0x18) = uVar5;
    puVar4 = (undefined8 *)(lVar24 + lVar27 * 0x18);
    *puVar4 = uVar6;
    puVar4[1] = uVar17;
  }
  (this->super_RNEMD).kineticExchange_ =
       (local_108 - local_110) + (this->super_RNEMD).kineticExchange_;
  return;
}

Assistant:

void SwapMethod::doRNEMDImpl(SelectionManager& smanA,
                               SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    RealType min_val(0.0);
    int min_found       = 0;
    StuntDouble* min_sd = NULL;

    RealType max_val(0.0);
    int max_found       = 0;
    StuntDouble* max_sd = NULL;

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }
      if (!max_found) {
        max_val   = value;
        max_sd    = sd;
        max_found = 1;
      } else {
        if (max_val < value) {
          max_val = value;
          max_sd  = sd;
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }

      if (!min_found) {
        min_val   = value;
        min_sd    = sd;
        min_found = 1;
      } else {
        if (min_val > value) {
          min_val = value;
          min_sd  = sd;
        }
      }
    }

#ifdef IS_MPI
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    int my_min_found = min_found;
    int my_max_found = max_found;

    // Even if we didn't find a minimum, did someone else?
    MPI_Allreduce(&my_min_found, &min_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
    // Even if we didn't find a maximum, did someone else?
    MPI_Allreduce(&my_max_found, &max_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
#endif

    if (max_found && min_found) {
#ifdef IS_MPI
      struct {
        RealType val;
        int rank;
      } max_vals, min_vals;

      if (my_min_found) {
        min_vals.val = min_val;
      } else {
        min_vals.val = HONKING_LARGE_VALUE;
      }
      min_vals.rank = worldRank;

      // Who had the minimum?
      MPI_Allreduce(&min_vals, &min_vals, 1, MPI_REALTYPE_INT, MPI_MINLOC,
                    MPI_COMM_WORLD);
      min_val = min_vals.val;

      if (my_max_found) {
        max_vals.val = max_val;
      } else {
        max_vals.val = -HONKING_LARGE_VALUE;
      }
      max_vals.rank = worldRank;

      // Who had the maximum?
      MPI_Allreduce(&max_vals, &max_vals, 1, MPI_REALTYPE_INT, MPI_MAXLOC,
                    MPI_COMM_WORLD);
      max_val = max_vals.val;
#endif

      if (min_val < max_val) {
#ifdef IS_MPI
        if (max_vals.rank == worldRank && min_vals.rank == worldRank) {
          // I have both maximum and minimum, so proceed like a single
          // processor version:
#endif

          Vector3d min_vel = min_sd->getVel();
          Vector3d max_vel = max_sd->getVel();
          RealType temp_vel;

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            max_sd->setVel(min_vel);
            if (min_sd->isDirectional() && max_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom = max_sd->getJ();
              min_sd->setJ(max_angMom);
              max_sd->setJ(min_angMom);
            }  // angular momenta exchange enabled
               // assumes same rigid body identity
            break;
          case rnemdPx:
            temp_vel    = min_vel.x();
            min_vel.x() = max_vel.x();
            max_vel.x() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            temp_vel    = min_vel.y();
            min_vel.y() = max_vel.y();
            max_vel.y() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            temp_vel    = min_vel.z();
            min_vel.z() = max_vel.z();
            max_vel.z() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }

#ifdef IS_MPI
          // the rest of the cases only apply in parallel simulations:
        } else if (max_vals.rank == worldRank) {
          // I had the max, but not the minimum

          Vector3d min_vel;
          Vector3d max_vel = max_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(max_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       min_vals.rank, 0, min_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, min_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            max_sd->setVel(min_vel);
            // angular momenta exchange enabled
            if (max_sd->isDirectional()) {
              Vector3d min_angMom;
              Vector3d max_angMom = max_sd->getJ();

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(max_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           min_vals.rank, 1, min_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, min_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              max_sd->setJ(min_angMom);
            }
            break;
          case rnemdPx:
            max_vel.x() = min_vel.x();
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            max_vel.y() = min_vel.y();
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            max_vel.z() = min_vel.z();
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }
        } else if (min_vals.rank == worldRank) {
          // I had the minimum but not the maximum:

          Vector3d max_vel;
          Vector3d min_vel = min_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(min_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       max_vals.rank, 0, max_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, max_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            // angular momenta exchange enabled
            if (min_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom;

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(min_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           max_vals.rank, 1, max_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, max_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              min_sd->setJ(max_angMom);
            }
            break;
          case rnemdPx:
            min_vel.x() = max_vel.x();
            min_sd->setVel(min_vel);
            break;
          case rnemdPy:
            min_vel.y() = max_vel.y();
            min_sd->setVel(min_vel);
            break;
          case rnemdPz:
            min_vel.z() = max_vel.z();
            min_sd->setVel(min_vel);
            break;
          default:
            break;
          }
        }
#endif

        switch (rnemdFluxType_) {
        case rnemdKE:
          kineticExchange_ += max_val - min_val;
          break;
        case rnemdPx:
          momentumExchange_.x() += max_val - min_val;
          break;
        case rnemdPy:
          momentumExchange_.y() += max_val - min_val;
          break;
        case rnemdPz:
          momentumExchange_.z() += max_val - min_val;
          break;
        default:
          break;
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::doSwap exchange NOT performed "
                 "because min_val > max_val\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        failTrialCount_++;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Swap exchange NOT performed because selected object\n"
               "\twas not present in at least one of the two slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }